

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EntityType::CreateTokenisedString
          (KString *__return_storage_ptr__,EntityType *this,KString *Seperator)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  KStringStream ss;
  ostream local_198 [376];
  KString *local_20;
  KString *Seperator_local;
  EntityType *this_local;
  
  local_20 = Seperator;
  Seperator_local = (KString *)this;
  this_local = (EntityType *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = (ostream *)std::ostream::operator<<(local_198,(ushort)this->m_ui8EntityKind);
  poVar1 = std::operator<<(poVar1,(string *)local_20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Domain);
  poVar1 = std::operator<<(poVar1,(string *)local_20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Country);
  poVar1 = std::operator<<(poVar1,(string *)local_20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Category);
  poVar1 = std::operator<<(poVar1,(string *)local_20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SubCategory);
  poVar1 = std::operator<<(poVar1,(string *)local_20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Specific);
  poVar1 = std::operator<<(poVar1,(string *)local_20);
  std::ostream::operator<<(poVar1,(ushort)this->m_ui8Extra);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

KString EntityType::CreateTokenisedString( const KString & Seperator /*= ","*/ ) const
{
    KStringStream ss;

    ss << ( KUINT16 )m_ui8EntityKind  << Seperator
       << ( KUINT16 )m_ui8Domain      << Seperator
       << m_ui16Country               << Seperator
       << ( KUINT16 )m_ui8Category    << Seperator
       << ( KUINT16 )m_ui8SubCategory << Seperator
       << ( KUINT16 )m_ui8Specific    << Seperator
       << ( KUINT16 )m_ui8Extra;

    return ss.str();
}